

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O1

void SubprocessSet::HandlePendingInterruption(void)

{
  int iVar1;
  sigset_t pending;
  sigset_t sStack_88;
  
  sigemptyset(&sStack_88);
  iVar1 = sigpending(&sStack_88);
  if (iVar1 == -1) {
    perror("ninja: sigpending");
  }
  else {
    iVar1 = sigismember(&sStack_88,2);
    if (iVar1 == 0) {
      iVar1 = sigismember(&sStack_88,0xf);
      if (iVar1 == 0) {
        iVar1 = sigismember(&sStack_88,1);
        if (iVar1 != 0) {
          interrupted_ = 1;
        }
      }
      else {
        interrupted_ = 0xf;
      }
    }
    else {
      interrupted_ = 2;
    }
  }
  return;
}

Assistant:

void SubprocessSet::HandlePendingInterruption() {
  sigset_t pending;
  sigemptyset(&pending);
  if (sigpending(&pending) == -1) {
    perror("ninja: sigpending");
    return;
  }
  if (sigismember(&pending, SIGINT))
    interrupted_ = SIGINT;
  else if (sigismember(&pending, SIGTERM))
    interrupted_ = SIGTERM;
  else if (sigismember(&pending, SIGHUP))
    interrupted_ = SIGHUP;
}